

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O0

int CfdFreeBuffer(void *address)

{
  void *in_RDI;
  
  cfd::Initialize();
  if (in_RDI != (void *)0x0) {
    free(in_RDI);
  }
  return 0;
}

Assistant:

int CfdFreeBuffer(void* address) {
  try {
    cfd::Initialize();
    if (address != nullptr) ::free(address);
    return kCfdSuccess;
  } catch (...) {
    return kCfdUnknownError;
  }
}